

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapeLinear>::InitMaterialData
          (TPZCompElH1<pzshape::TPZShapeLinear> *this,TPZMaterialData *data)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  TPZGeoEl *pTVar4;
  long lVar5;
  long *plVar6;
  double *pdVar7;
  int64_t newsize;
  int i;
  ulong uVar8;
  ulong uVar9;
  TPZManVector<long,_2> ids;
  TPZManVector<int,_3> orders;
  uint64_t ducol;
  uint64_t durow;
  uint64_t ulen;
  TPZVec<int> local_100;
  int aiStack_e0 [2];
  undefined **local_d8;
  undefined **local_d0;
  undefined **local_c8;
  TPZVec<long> local_c0;
  long local_a0 [2];
  TPZVec<int> local_90;
  uint local_70 [4];
  long *local_60;
  undefined4 local_58 [2];
  undefined4 local_50 [2];
  TPZGeoElSide local_48;
  
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  data->gelElId = (int)pTVar4->fId;
  lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))(this);
  if (lVar5 == 0) {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)__dynamic_cast(lVar5,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                                    0xfffffffffffffffe);
  }
  TPZVec<long>::TPZVec(&local_c0,0);
  local_c8 = &PTR__TPZManVector_018432e0;
  local_c0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018432e0;
  local_c0.fStore = local_a0;
  local_c0.fNElements = 2;
  local_c0.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_90,0);
  local_90.fStore = (int *)local_70;
  local_d0 = &PTR__TPZManVector_018437d0;
  local_90._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  local_90.fNElements = 1;
  local_90.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_100,0);
  local_100.fStore = aiStack_e0;
  local_d8 = &PTR__TPZManVector_018443d0;
  local_100._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018443d0;
  local_100.fNElements = 2;
  local_100.fNAlloc = 0;
  aiStack_e0[0] = 0;
  aiStack_e0[1] = 0;
  pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
  uVar8 = 0;
  do {
    lVar5 = (**(code **)(*(long *)pTVar4 + 0xa8))(pTVar4,uVar8 & 0xffffffff);
    local_c0.fStore[uVar8] = lVar5;
    uVar8 = uVar8 + 1;
  } while (uVar8 == 1);
  lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xa8))(this,2);
  *local_90.fStore = (uint)*(byte *)(lVar5 + 0x14);
  TPZShapeH1<pzshape::TPZShapeLinear>::Initialize(&local_c0,&local_90,&data->super_TPZShapeData);
  (**(code **)(*plVar6 + 0x48))(plVar6);
  local_60 = plVar6;
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb0))(this);
  lVar5 = (data->super_TPZShapeData).fPhi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))(this);
  uVar3 = (**(code **)(*plVar6 + 0x78))(plVar6);
  (data->super_TPZShapeData).fShapeType = EScalarShape;
  uVar8 = (ulong)(int)lVar5;
  if (uVar8 != (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
               * (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow) {
    pdVar7 = (data->phi).super_TPZFMatrix<double>.fElem;
    if ((pdVar7 != (double *)0x0) && (pdVar7 != (data->phi).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar7);
    }
    lVar5 = lVar5 << 0x20;
    pdVar7 = (data->phi).super_TPZFMatrix<double>.fGiven;
    if ((pdVar7 == (double *)0x0) || ((data->phi).super_TPZFMatrix<double>.fSize < (long)uVar8)) {
      if (lVar5 == 0) {
        pdVar7 = (double *)0x0;
      }
      else {
        pdVar7 = (double *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | lVar5 >> 0x1d);
      }
    }
    (data->phi).super_TPZFMatrix<double>.fElem = pdVar7;
    if ((lVar5 != 0) && (pdVar7 == (double *)0x0)) {
      TPZFMatrix<double>::Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar8;
  (data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  (*(data->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->phi);
  lVar5 = (long)iVar2;
  uVar9 = uVar8 * lVar5;
  if (uVar9 - (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol * (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow != 0) {
    pdVar7 = (data->dphix).super_TPZFMatrix<double>.fElem;
    if ((pdVar7 != (double *)0x0) && (pdVar7 != (data->dphix).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar7);
    }
    pdVar7 = (data->dphix).super_TPZFMatrix<double>.fGiven;
    if ((pdVar7 == (double *)0x0) ||
       (lVar1 = (data->dphix).super_TPZFMatrix<double>.fSize,
       uVar9 - lVar1 != 0 && lVar1 <= (long)uVar9)) {
      if (uVar9 == 0) {
        pdVar7 = (double *)0x0;
      }
      else {
        pdVar7 = (double *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
      }
    }
    (data->dphix).super_TPZFMatrix<double>.fElem = pdVar7;
    if ((uVar9 != 0) && (pdVar7 == (double *)0x0)) {
      TPZFMatrix<double>::Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar5;
  (data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar8;
  (*(data->dphix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->dphix);
  uVar8 = lVar5 * 3;
  if (uVar8 != (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
               fCol * (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow) {
    pdVar7 = (data->axes).super_TPZFMatrix<double>.fElem;
    if ((pdVar7 != (double *)0x0) && (pdVar7 != (data->axes).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar7);
    }
    pdVar7 = (data->axes).super_TPZFMatrix<double>.fGiven;
    if ((pdVar7 == (double *)0x0) || ((data->axes).super_TPZFMatrix<double>.fSize < (long)uVar8)) {
      if (iVar2 == 0) {
        pdVar7 = (double *)0x0;
      }
      else {
        pdVar7 = (double *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | lVar5 * 0x18);
      }
    }
    (data->axes).super_TPZFMatrix<double>.fElem = pdVar7;
    if ((iVar2 != 0) && (pdVar7 == (double *)0x0)) {
      TPZFMatrix<double>::Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar5;
  (data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  (*(data->axes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->axes);
  uVar8 = lVar5 * lVar5;
  if (uVar8 - (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol * (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow != 0) {
    pdVar7 = (data->jacobian).super_TPZFMatrix<double>.fElem;
    if ((pdVar7 != (double *)0x0) && (pdVar7 != (data->jacobian).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar7);
    }
    pdVar7 = (data->jacobian).super_TPZFMatrix<double>.fGiven;
    if ((pdVar7 == (double *)0x0) ||
       (lVar1 = (data->jacobian).super_TPZFMatrix<double>.fSize,
       uVar8 - lVar1 != 0 && lVar1 <= (long)uVar8)) {
      if (iVar2 == 0) {
        pdVar7 = (double *)0x0;
      }
      else {
        pdVar7 = (double *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
      }
    }
    (data->jacobian).super_TPZFMatrix<double>.fElem = pdVar7;
    if ((iVar2 != 0) && (pdVar7 == (double *)0x0)) {
      TPZFMatrix<double>::Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar5
  ;
  (data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar5
  ;
  (*(data->jacobian).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->jacobian);
  if (uVar8 - (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol * (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow != 0) {
    pdVar7 = (data->jacinv).super_TPZFMatrix<double>.fElem;
    if ((pdVar7 != (double *)0x0) && (pdVar7 != (data->jacinv).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar7);
    }
    pdVar7 = (data->jacinv).super_TPZFMatrix<double>.fGiven;
    if ((pdVar7 == (double *)0x0) ||
       (lVar1 = (data->jacinv).super_TPZFMatrix<double>.fSize,
       uVar8 - lVar1 != 0 && lVar1 <= (long)uVar8)) {
      if (iVar2 == 0) {
        pdVar7 = (double *)0x0;
      }
      else {
        pdVar7 = (double *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
      }
    }
    (data->jacinv).super_TPZFMatrix<double>.fElem = pdVar7;
    if ((iVar2 != 0) && (pdVar7 == (double *)0x0)) {
      TPZFMatrix<double>::Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar5;
  (data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar5;
  (*(data->jacinv).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->jacinv);
  TPZManVector<double,_3>::Resize(&data->x,3);
  if (data->fNeedsSol == true) {
    (**(code **)(*local_60 + 0x60))(local_60,&local_48,local_50,local_58);
    (**(code **)(*(long *)&data->super_TPZShapeData + 0x50))
              (data,uVar3,local_48.super_TPZSavable._vptr_TPZSavable._0_4_,local_50[0],local_58[0]);
  }
  if (data->fNeedsNeighborCenter == true) {
    TPZGeoElSide::TPZGeoElSide(&local_48,pTVar4);
    TPZGeoElSide::CenterX(&local_48,&(data->XCenter).super_TPZVec<double>);
  }
  if (local_100.fStore == aiStack_e0) {
    local_100.fStore = (int *)0x0;
  }
  local_100.fNAlloc = 0;
  local_100._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_100.fStore != (int *)0x0) {
    operator_delete__(local_100.fStore);
  }
  if ((uint *)local_90.fStore == local_70) {
    local_90.fStore = (int *)0x0;
  }
  local_90.fNAlloc = 0;
  local_90._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if ((uint *)local_90.fStore != (uint *)0x0) {
    operator_delete__(local_90.fStore);
  }
  if (local_c0.fStore == local_a0) {
    local_c0.fStore = (long *)0x0;
  }
  local_c0.fNAlloc = 0;
  local_c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_c0.fStore != (long *)0x0) {
    operator_delete__(local_c0.fStore);
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::InitMaterialData(TPZMaterialData &data){
  data.gelElId = this->Reference()->Id();
    auto *mat =
        dynamic_cast<TPZMatSingleSpace*>(this->Material());
#ifdef PZDEBUG
    if(!mat)
    {
        DebugStop();
    }
#endif
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NSides-TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodeIndex(i);
    for(int i=TSHAPE::NCornerNodes; i<TSHAPE::NSides; i++) orders[i-TSHAPE::NCornerNodes] = this->Connect(i).Order();
    TPZShapeData &shapedata = data;
    TPZShapeH1<TSHAPE>::Initialize(ids, orders, shapedata);
    mat->FillDataRequirements(data);
    const int dim = this->Dimension();
    const int nshape = data.fPhi.Rows();
    const int nstate = this->Material()->NStateVariables();
    data.fShapeType = TPZMaterialData::EScalarShape;
    data.phi.Redim(nshape,1);
//    data.dphi.Redim(dim,nshape);
    data.dphix.Redim(dim,nshape);
    data.axes.Redim(dim,3);
    data.jacobian.Redim(dim,dim);
    data.jacinv.Redim(dim,dim);
    data.x.Resize(3);
    if (data.fNeedsSol){
        uint64_t ulen,durow,ducol;
        mat->GetSolDimensions(ulen,durow,ducol);
        data.SetSolSizes(nstate, ulen, durow, ducol);
    }
    if(data.fNeedsNeighborCenter)
    {
        TPZGeoElSide gelside(gel);
        gelside.CenterX(data.XCenter);
    }
    
}